

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

golf_entity_t *
golf_entity_geo(golf_entity_t *__return_storage_ptr__,char *name,golf_transform_t transform,
               golf_movement_t movement,golf_geo_t geo,golf_lightmap_section_t lightmap_section)

{
  long lVar1;
  golf_lightmap_section_t *pgVar2;
  anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *paVar3;
  byte bVar4;
  
  bVar4 = 0;
  __return_storage_ptr__->active = true;
  __return_storage_ptr__->parent_idx = -1;
  __return_storage_ptr__->type = GEO_ENTITY;
  snprintf(__return_storage_ptr__->name,0x40,"%s",name);
  *(undefined8 *)((long)&__return_storage_ptr__->field_4 + 0x60) = transform.position._0_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->field_4 + 0x68) = transform._8_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->field_4 + 0x70) = transform.rotation._4_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->field_4 + 0x78) = transform._24_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->field_4 + 0x80) = transform.scale._4_8_;
  (__return_storage_ptr__->field_4).water.geo.generator_data.script =
       (golf_script_t *)movement._0_8_;
  (__return_storage_ptr__->field_4).water.geo.generator_data.args.data =
       (golf_geo_generator_data_arg_t *)movement._8_8_;
  (((golf_geo_t *)((long)&(__return_storage_ptr__->field_4).water + 0x88))->generator_data).args.
  length = movement.field_4._0_4_;
  (((golf_geo_t *)((long)&(__return_storage_ptr__->field_4).water + 0x88))->generator_data).args.
  capacity = movement.field_4._4_4_;
  (__return_storage_ptr__->field_4).water.geo.generator_data.args.alloc_category =
       (char *)movement.field_4._8_8_;
  (__return_storage_ptr__->field_4).water.geo.points.data =
       (golf_geo_point_t *)movement.field_4._16_8_;
  memcpy((void *)((long)&__return_storage_ptr__->field_4 + 0xb0),&geo,0xe8);
  pgVar2 = &lightmap_section;
  paVar3 = &__return_storage_ptr__->field_4;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)paVar3 = *(undefined8 *)pgVar2->lightmap_name;
    pgVar2 = (golf_lightmap_section_t *)((long)pgVar2 + (ulong)bVar4 * -0x10 + 8);
    paVar3 = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)
             ((long)paVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

golf_entity_t golf_entity_geo(const char *name, golf_transform_t transform, golf_movement_t movement, golf_geo_t geo, golf_lightmap_section_t lightmap_section) {
    golf_entity_t entity;
    entity.active = true;
    entity.parent_idx = -1;
    entity.type = GEO_ENTITY;
    snprintf(entity.name, GOLF_MAX_NAME_LEN, "%s", name);
    entity.geo.transform = transform;
    entity.geo.movement = movement;
    entity.geo.geo = geo;
    entity.geo.lightmap_section = lightmap_section;
    return entity;
}